

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createSphere(BulletEngine *this,aphy_scalar radius)

{
  btConvexInternalShape *this_00;
  BulletCollisionShape *this_01;
  collision_shape_ptr prVar1;
  
  this_00 = (btConvexInternalShape *)btAlignedAllocInternal(0x48,0x10);
  btConvexInternalShape::btConvexInternalShape(this_00);
  (this_00->super_btConvexShape).super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btConvexShape_0021e930;
  (this_00->super_btConvexShape).super_btCollisionShape.m_shapeType = 8;
  (this_00->m_implicitShapeDimensions).m_floats[0] = radius;
  this_00->m_collisionMargin = radius;
  this_01 = (BulletCollisionShape *)operator_new(0x20);
  BulletCollisionShape::BulletCollisionShape(this_01,(btCollisionShape *)this_00,Generic);
  prVar1 = (collision_shape_ptr)operator_new(0x18);
  prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar1->object = (collision_shape *)this_01;
  prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_01->super_collision_shape).super_base_interface.myRefCounter = prVar1;
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createSphere(aphy_scalar radius)
{
    return makeObject<BulletCollisionShape> (
        new btSphereShape(radius)
    ).disown();
}